

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  long lVar1;
  byte bVar2;
  TString *pTVar3;
  TValue *io;
  
  if (errcode == 0) {
    bVar2 = 0;
  }
  else {
    if (errcode == 5) {
      pTVar3 = luaS_newlstr(L,"error in error handling",0x17);
    }
    else {
      if (errcode != 4) {
        lVar1 = (L->top).offset;
        (oldtop->val).value_ = *(Value *)(lVar1 + -0x10);
        bVar2 = *(byte *)(lVar1 + -8);
        goto LAB_00118e95;
      }
      pTVar3 = L->l_G->memerrmsg;
    }
    (oldtop->val).value_.gc = (GCObject *)pTVar3;
    bVar2 = pTVar3->tt | 0x40;
  }
LAB_00118e95:
  (oldtop->val).tt_ = bVar2;
  (L->top).p = oldtop + 1;
  return;
}

Assistant:

void luaD_seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {  /* memory error? */
      setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
    case LUA_OK: {  /* special case only for closing upvalues */
      setnilvalue(s2v(oldtop));  /* no error message */
      break;
    }
    default: {
      lua_assert(errorstatus(errcode));  /* real error */
      setobjs2s(L, oldtop, L->top.p - 1);  /* error message on current top */
      break;
    }
  }
  L->top.p = oldtop + 1;
}